

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

void init_motion_estimation(AV1_COMP *cpi)

{
  int iVar1;
  uint uVar2;
  RefCntBuffer *pRVar3;
  av1_init_search_site_config p_Var4;
  uint stride;
  uint uVar5;
  search_site_config *psVar6;
  uint uVar7;
  SEARCH_METHODS i;
  long lVar8;
  
  iVar1 = (cpi->common).width;
  uVar5 = (iVar1 + 7U & 0xfffffff8) + (cpi->oxcf).border_in_pixels * 2 + 0x1f & 0xffffffe0;
  uVar7 = uVar5;
  if ((((cpi->oxcf).frm_dim_cfg.width == iVar1) &&
      ((cpi->oxcf).frm_dim_cfg.height == (cpi->common).height)) &&
     (iVar1 == (cpi->common).superres_upscaled_width)) {
    uVar7 = (cpi->ppi->lookahead->buf->img).field_4.field_0.y_stride;
  }
  pRVar3 = (cpi->common).cur_frame;
  stride = uVar5;
  if (pRVar3 != (RefCntBuffer *)0x0) {
    stride = (pRVar3->buf).field_4.field_0.y_stride;
  }
  uVar2 = (cpi->mv_search_params).search_site_cfg[0][0].stride;
  if (((uVar2 == 0) || ((cpi->mv_search_params).search_site_cfg[1][0].stride == 0)) ||
     (uVar5 != uVar2)) {
    psVar6 = (cpi->mv_search_params).search_site_cfg[0];
    for (lVar8 = 0; lVar8 != 7; lVar8 = lVar8 + 1) {
      p_Var4 = av1_init_motion_compensation[lVar8];
      iVar1 = SUB14(((uint)lVar8 & 6) == 2,0);
      (*p_Var4)(psVar6,uVar5,iVar1);
      (*p_Var4)(psVar6 + 7,uVar7,iVar1);
      psVar6 = psVar6 + 1;
    }
    psVar6 = (cpi->mv_search_params).search_site_cfg[2];
    av1_init_motion_fpf(psVar6,stride);
    for (lVar8 = 0; lVar8 != 0x4a70; lVar8 = lVar8 + 0xc68) {
      memcpy((void *)((long)&(cpi->mv_search_params).search_site_cfg[2][1].site[0][0].mv.row + lVar8
                     ),psVar6,0xc68);
    }
  }
  return;
}

Assistant:

static void init_motion_estimation(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MotionVectorSearchParams *const mv_search_params = &cpi->mv_search_params;
  const int aligned_width = (cm->width + 7) & ~7;
  const int y_stride =
      aom_calc_y_stride(aligned_width, cpi->oxcf.border_in_pixels);
  const int y_stride_src = ((cpi->oxcf.frm_dim_cfg.width != cm->width ||
                             cpi->oxcf.frm_dim_cfg.height != cm->height) ||
                            av1_superres_scaled(cm))
                               ? y_stride
                               : cpi->ppi->lookahead->buf->img.y_stride;
  int fpf_y_stride =
      cm->cur_frame != NULL ? cm->cur_frame->buf.y_stride : y_stride;

  // Update if search_site_cfg is uninitialized or the current frame has a new
  // stride
  const int should_update =
      !mv_search_params->search_site_cfg[SS_CFG_SRC][DIAMOND].stride ||
      !mv_search_params->search_site_cfg[SS_CFG_LOOKAHEAD][DIAMOND].stride ||
      (y_stride !=
       mv_search_params->search_site_cfg[SS_CFG_SRC][DIAMOND].stride);

  if (!should_update) {
    return;
  }

  // Initialization of search_site_cfg for NUM_DISTINCT_SEARCH_METHODS.
  for (SEARCH_METHODS i = DIAMOND; i < NUM_DISTINCT_SEARCH_METHODS; i++) {
    const int level = ((i == NSTEP_8PT) || (i == CLAMPED_DIAMOND)) ? 1 : 0;
    av1_init_motion_compensation[i](
        &mv_search_params->search_site_cfg[SS_CFG_SRC][i], y_stride, level);
    av1_init_motion_compensation[i](
        &mv_search_params->search_site_cfg[SS_CFG_LOOKAHEAD][i], y_stride_src,
        level);
  }

  // First pass search site config initialization.
  av1_init_motion_fpf(&mv_search_params->search_site_cfg[SS_CFG_FPF][DIAMOND],
                      fpf_y_stride);
  for (SEARCH_METHODS i = NSTEP; i < NUM_DISTINCT_SEARCH_METHODS; i++) {
    memcpy(&mv_search_params->search_site_cfg[SS_CFG_FPF][i],
           &mv_search_params->search_site_cfg[SS_CFG_FPF][DIAMOND],
           sizeof(search_site_config));
  }
}